

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::Write<long>::Write(Write<long> *this,LO size_in,long value,string *name_in)

{
  Write<long> local_38;
  string *local_28;
  string *name_in_local;
  long value_local;
  Write<long> *pWStack_10;
  LO size_in_local;
  Write<long> *this_local;
  
  local_28 = name_in;
  name_in_local = (string *)value;
  value_local._4_4_ = size_in;
  pWStack_10 = this;
  Write(this,size_in,name_in);
  Write(&local_38,(Write<int> *)this);
  fill<long>(&local_38,(long)name_in_local);
  ~Write(&local_38);
  return;
}

Assistant:

Write<T>::Write(LO size_in, T value, std::string const& name_in)
    : Write<T>(size_in, name_in) {
  fill(*this, value);
}